

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_aout.c
# Opt level: O0

Symbol * aout_lnksym(GlobalVars *gv,Section *sec,Reloc *xref)

{
  int iVar1;
  Symbol *pSVar2;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  GlobalVars *unaff_retaddr;
  uint8_t in_stack_00000010;
  uint32_t in_stack_00000018;
  int i;
  Symbol *sym;
  uint32_t local_2c;
  char *in_stack_fffffffffffffff8;
  
  if (*(int *)(in_RDI + 0x5c) == 0) {
    for (local_2c = 0; (int)local_2c < 3; local_2c = local_2c + 1) {
      iVar1 = strcmp(aout_symnames[(int)local_2c],*(char **)(in_RDX + 0x10));
      if (iVar1 == 0) {
        pSVar2 = addlnksymbol(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,
                              (uint8_t)((ulong)in_RSI >> 0x38),(uint8_t)((ulong)in_RSI >> 0x30),
                              (uint8_t)((ulong)in_RSI >> 0x28),in_stack_00000010,in_stack_00000018);
        pSVar2->extra = local_2c;
        if (local_2c == 0) {
          *(char **)(in_RDI + 0x248) = aout_symnames[0];
          pSVar2->type = '\x02';
          return pSVar2;
        }
        if (local_2c != 1) {
          return pSVar2;
        }
        *(char **)(in_RDI + 0x248) = aout_symnames[1];
        pSVar2->type = '\x02';
        return pSVar2;
      }
    }
  }
  return (Symbol *)0x0;
}

Assistant:

struct Symbol *aout_lnksym(struct GlobalVars *gv,struct Section *sec,
                           struct Reloc *xref)
/* Check for common a.out linker symbols. */
{
  struct Symbol *sym;
  int i;

  if (!gv->dest_object) {
    for (i=0; i<AOUTSTD_LNKSYMS; i++) {
      if (!strcmp(aout_symnames[i],xref->xrefname)) {
        sym = addlnksymbol(gv,aout_symnames[i],0,SYM_ABS,
                           SYMF_LNKSYM,SYMI_OBJECT,SYMB_GLOBAL,0);
        sym->extra = i; /* for easy ident. in aout_setlnksym */
        switch (i) {
          case GOTSYM:
            gv->got_base_name = aout_symnames[i];
            sym->type = SYM_RELOC;
            break;
          case PLTSYM:
            gv->got_base_name = aout_symnames[i];
            sym->type = SYM_RELOC;
            break;
          case DYNAMICSYM:
            break;
        }
        return (sym);  /* new linker symbol created */
      }
    }
  }
  return (NULL);
}